

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::GetTllSignatureTraces(cmTarget *this,ostream *s,TLLSignature sig)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  pointer ppVar2;
  ostream *poVar3;
  cmState *this_00;
  string *psVar4;
  char *pcVar5;
  pointer ppVar6;
  cmListFileContext lfc;
  cmStateDirectory cmDir;
  undefined1 local_c0 [32];
  string local_a0;
  cmStateDirectory local_78;
  string local_50;
  
  pcVar5 = "plain";
  if (sig == KeywordTLLSignature) {
    pcVar5 = "keyword";
  }
  poVar3 = std::operator<<(s,"The uses of the ");
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::operator<<(poVar3," signature are here:\n");
  cmMakefile::GetStateSnapshot
            (((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
  cmStateSnapshot::GetDirectory(&local_78,(cmStateSnapshot *)local_c0);
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  ppVar2 = *(pointer *)((long)&(_Var1._M_head_impl)->TLLCommands + 8);
  for (ppVar6 = *(pointer *)
                 &((_Var1._M_head_impl)->TLLCommands).
                  super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
      ; ppVar6 != ppVar2; ppVar6 = ppVar6 + 1) {
    if (ppVar6->first == sig) {
      cmListFileContext::cmListFileContext((cmListFileContext *)local_c0,&ppVar6->second);
      this_00 = cmMakefile::GetState
                          (((this->impl)._M_t.
                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                            .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                           Makefile);
      psVar4 = cmState::GetSourceDirectory_abi_cxx11_(this_00);
      cmStateDirectory::ConvertToRelPathIfNotContained
                (&local_50,&local_78,psVar4,(string *)(local_c0 + 0x20));
      std::__cxx11::string::operator=((string *)(local_c0 + 0x20),(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      poVar3 = std::operator<<(s," * ");
      poVar3 = operator<<(poVar3,(cmListFileContext *)local_c0);
      std::endl<char,std::char_traits<char>>(poVar3);
      cmListFileContext::~cmListFileContext((cmListFileContext *)local_c0);
    }
  }
  return;
}

Assistant:

void cmTarget::GetTllSignatureTraces(std::ostream& s, TLLSignature sig) const
{
  const char* sigString =
    (sig == cmTarget::KeywordTLLSignature ? "keyword" : "plain");
  s << "The uses of the " << sigString << " signature are here:\n";
  cmStateDirectory cmDir = impl->Makefile->GetStateSnapshot().GetDirectory();
  for (auto const& cmd : impl->TLLCommands) {
    if (cmd.first == sig) {
      cmListFileContext lfc = cmd.second;
      lfc.FilePath = cmDir.ConvertToRelPathIfNotContained(
        impl->Makefile->GetState()->GetSourceDirectory(), lfc.FilePath);
      s << " * " << lfc << std::endl;
    }
  }
}